

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugins_exts.c
# Opt level: O2

LY_ERR lyplg_ext_compile_extension_instance
                 (lysc_ctx *ctx,lysp_ext_instance *extp,lysc_ext_instance *ext)

{
  int *piVar1;
  ly_stmt lVar2;
  lysp_ext_substmt *plVar3;
  lysp_node **object;
  lysc_ext_substmt *plVar4;
  lysp_type *type_p;
  lysc_ident *plVar5;
  void *pvVar6;
  char *pcVar7;
  uint16_t inherited_flags;
  lysc_ext_substmt *plVar8;
  ly_bool lVar9;
  ushort uVar10;
  LY_ERR LVar11;
  lysc_node *node;
  long *plVar12;
  char *pcVar13;
  char *pcVar14;
  void **ppvVar15;
  lysc_ext_substmt *plVar16;
  LY_ERR LVar17;
  void **ppvVar18;
  lysp_node *plVar19;
  lysp_ext_instance *extp_00;
  ly_ctx *plVar20;
  lysc_ident **identities;
  lysp_node **pplVar21;
  long lVar22;
  lysp_ext_instance *plVar23;
  lysp_ext_instance *plVar24;
  void **ppvVar25;
  uint16_t flags_2;
  ly_bool enabled;
  lysp_node *local_50;
  ly_set storagep_compiled;
  
  storagep_compiled.size = 0;
  storagep_compiled.count = 0;
  storagep_compiled.field_2.dnodes = (lyd_node **)0x0;
  if (ctx == (lysc_ctx *)0x0) {
    pcVar13 = "ctx";
    plVar20 = (ly_ctx *)0x0;
LAB_0019423a:
    ly_log(plVar20,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).",pcVar13,
           "lyplg_ext_compile_extension_instance");
    return LY_EINVAL;
  }
  if (extp == (lysp_ext_instance *)0x0) {
    plVar20 = ctx->ctx;
    pcVar13 = "extp";
    goto LAB_0019423a;
  }
  if (ext == (lysc_ext_instance *)0x0) {
    plVar20 = ctx->ctx;
    pcVar13 = "ext";
    goto LAB_0019423a;
  }
  ctx->ext = ext;
  ppvVar25 = (void **)0x0;
LAB_00193a59:
  plVar3 = extp->substmts;
  if (plVar3 == (lysp_ext_substmt *)0x0) {
    ppvVar15 = (void **)0x0;
  }
  else {
    ppvVar15 = plVar3[-1].storage_p;
  }
  if (ppvVar15 <= ppvVar25) {
    LVar11 = LY_SUCCESS;
LAB_00194207:
    ctx->ext = (lysc_ext_instance *)0x0;
    ly_set_erase(&storagep_compiled,(_func_void_void_ptr *)0x0);
    return LVar11;
  }
  object = (lysp_node **)plVar3[(long)ppvVar25].storage_p;
  if (*object == (lysp_node *)0x0) goto LAB_00193d81;
  lVar2 = plVar3[(long)ppvVar25].stmt;
  lVar9 = ly_set_contains(&storagep_compiled,object,(uint32_t *)0x0);
  if (lVar9 != '\0') goto LAB_00193d81;
  plVar4 = ext->substmts;
  ppvVar15 = (void **)0xffffffffffffffff;
  plVar8 = plVar4;
  do {
    plVar16 = plVar8;
    if (plVar4 == (lysc_ext_substmt *)0x0) {
      ppvVar18 = (void **)0x0;
    }
    else {
      ppvVar18 = plVar4[-1].storage_p;
    }
    ppvVar15 = (void **)((long)ppvVar15 + 1);
    if (ppvVar18 <= ppvVar15) goto LAB_00193d67;
    plVar8 = plVar16 + 1;
  } while (lVar2 != plVar16->stmt);
  if (*object == (lysp_node *)0x0) {
    __assert_fail("*parsed_p",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts.c"
                  ,0x61,
                  "LY_ERR lys_compile_ext_instance_stmt(struct lysc_ctx *, void **, struct lysc_ext_instance *, struct lysc_ext_substmt *)"
                 );
  }
  LVar17 = LY_SUCCESS;
  if (lVar2 == LY_STMT_IF_FEATURE) {
    LVar11 = lys_eval_iffeatures(ctx->ctx,(lysp_qname *)*object,&enabled);
    LVar17 = LY_SUCCESS;
    if (enabled == '\0') {
      LVar17 = LY_ENOT;
    }
    if (LVar11 != LY_SUCCESS) goto LAB_00194207;
  }
  LVar11 = LVar17;
  identities = (lysc_ident **)plVar16->storage_p;
  if (identities != (lysc_ident **)0x0) {
    lVar2 = plVar16->stmt;
    if (((((lVar2 - LY_STMT_NOTIFICATION < 0x40) &&
          ((0x800000008000808bU >> ((ulong)(lVar2 - LY_STMT_NOTIFICATION) & 0x3f) & 1) != 0)) ||
         (lVar2 == LY_STMT_CASE)) ||
        (((lVar2 == LY_STMT_CHOICE || (lVar2 == LY_STMT_CONTAINER)) ||
         ((lVar2 == LY_STMT_LEAF || ((lVar2 == LY_STMT_LEAF_LIST || (lVar2 == LY_STMT_LIST))))))))
       || (lVar2 == LY_STMT_USES)) {
      lyplg_ext_get_storage(ext,0x2c0000,2,(void **)&enabled);
      inherited_flags = _enabled;
      pplVar21 = object;
      while (plVar19 = *pplVar21, plVar19 != (lysp_node *)0x0) {
        if ((plVar19->nodetype & 0x3000) == 0) {
          LVar11 = lys_compile_node(ctx,plVar19,(lysc_node *)0x0,inherited_flags,(ly_set *)0x0);
        }
        else {
          node = (lysc_node *)calloc(1,0x60);
          if (node == (lysc_node *)0x0) {
            LVar11 = LY_EMEM;
            ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).");
            break;
          }
          LVar11 = lys_compile_node_action_inout(ctx,plVar19,node);
          if (LVar11 != LY_SUCCESS) break;
          LVar11 = lys_compile_node_connect(ctx,(lysc_node *)0x0,node);
        }
        if (LVar11 != LY_SUCCESS) break;
        LVar11 = LY_SUCCESS;
        pplVar21 = &plVar19->next;
      }
    }
    else {
      if (lVar2 == LY_STMT_ARGUMENT) goto LAB_00193d46;
      if (lVar2 == LY_STMT_BIT) {
LAB_00193e8b:
        LVar11 = lys_compile_type_enums
                           (ctx,(lysp_type_enum *)*object,
                            (uint)(lVar2 == LY_STMT_ENUM) * 4 + LY_TYPE_BITS,
                            (lysc_type_bitenum_item *)0x0,(lysc_type_bitenum_item **)identities);
      }
      else if (lVar2 == LY_STMT_CONFIG) {
        if ((ctx->compile_opts & 4) == 0) {
          if ((*(ushort *)object & 3) == 0) {
            if ((ext->parent_stmt &
                (LY_STMT_LIST|LY_STMT_LEAF_LIST|LY_STMT_LEAF|LY_STMT_CONTAINER|LY_STMT_CHOICE|
                 LY_STMT_CASE|LY_STMT_ANYXML|LY_STMT_ANYDATA)) == LY_STMT_NONE) {
              uVar10 = 1;
            }
            else {
              uVar10 = *(ushort *)((long)ext->parent + 2) & 3;
            }
          }
          else {
            uVar10 = *(ushort *)object | 0x800;
          }
          *(ushort *)identities = uVar10;
        }
      }
      else {
        if ((lVar2 != LY_STMT_CONTACT) && (lVar2 != LY_STMT_DESCRIPTION)) {
          if (lVar2 == LY_STMT_ENUM) goto LAB_00193e8b;
          if ((lVar2 != LY_STMT_ERROR_APP_TAG) && (lVar2 != LY_STMT_ERROR_MESSAGE)) {
            if (lVar2 == LY_STMT_EXTENSION_INSTANCE) {
              plVar23 = (lysp_ext_instance *)*object;
              if (plVar23 != (lysp_ext_instance *)0x0) {
                plVar5 = *identities;
                if (plVar5 == (lysc_ident *)0x0) {
                  plVar12 = (long *)calloc(1,(long)plVar23[-1].exts * 0x48 + 8);
                  if (plVar12 != (long *)0x0) {
                    lVar22 = 0;
                    goto LAB_00194111;
                  }
                }
                else {
                  lVar22 = *(long *)&plVar5[-1].flags;
                  plVar12 = (long *)realloc(&plVar5[-1].flags,
                                            ((long)&(plVar23[-1].exts)->name + lVar22 * 2) * 0x48 +
                                            8);
                  if (plVar12 != (long *)0x0) {
                    identities = (lysc_ident **)plVar16->storage_p;
LAB_00194111:
                    *identities = (lysc_ident *)(plVar12 + 1);
                    if (*plVar16->storage_p != (void *)0x0) {
                      memset((void *)((long)*plVar16->storage_p + *plVar12 * 0x48),0,
                             ((long)&(plVar23[-1].exts)->name + lVar22) * 0x48);
                    }
                    extp_00 = plVar23;
                    for (plVar24 = (lysp_ext_instance *)0x0; plVar24 < plVar23[-1].exts;
                        plVar24 = (lysp_ext_instance *)((long)&plVar24->name + 1)) {
                      pvVar6 = *plVar16->storage_p;
                      lVar22 = *(long *)((long)pvVar6 + -8);
                      *(long *)((long)pvVar6 + -8) = lVar22 + 1;
                      LVar11 = lys_compile_ext(ctx,extp_00,
                                               (lysc_ext_instance *)(lVar22 * 0x48 + (long)pvVar6),
                                               ext);
                      if (LVar11 != LY_SUCCESS) {
                        if (LVar11 != LY_ENOT) goto LAB_00194207;
                        plVar12 = (long *)((long)*plVar16->storage_p + -8);
                        *plVar12 = *plVar12 + -1;
                      }
                      extp_00 = extp_00 + 1;
                      LVar11 = LY_SUCCESS;
                    }
                    goto LAB_00193d5c;
                  }
                }
LAB_0019435a:
                LVar11 = LY_EMEM;
                ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                       "lys_compile_ext_instance_stmt");
                goto LAB_00194207;
              }
            }
            else if (lVar2 == LY_STMT_FRACTION_DIGITS) {
LAB_00193e67:
              *(undefined1 *)identities = *(undefined1 *)object;
            }
            else if (lVar2 == LY_STMT_IDENTITY) {
              LVar11 = lys_identity_precompile
                                 (ctx,(ly_ctx *)0x0,(lysp_module *)0x0,(lysp_ident *)*object,
                                  identities);
            }
            else {
              if (lVar2 == LY_STMT_KEY) goto LAB_00193d46;
              if (lVar2 == LY_STMT_LENGTH) {
                lVar9 = '\x01';
LAB_0019400d:
                LVar11 = lys_compile_type_range
                                   (ctx,(lysp_restr *)*object,LY_TYPE_UINT64,lVar9,'\0',
                                    (lysc_range *)0x0,(lysc_range **)identities);
              }
              else {
                if (lVar2 == LY_STMT_MANDATORY) {
LAB_00193e31:
                  *(ushort *)identities = *(ushort *)object;
                  goto LAB_00193d5c;
                }
                if ((lVar2 != LY_STMT_MAX_ELEMENTS) && (lVar2 != LY_STMT_MIN_ELEMENTS)) {
                  if (lVar2 == LY_STMT_MODIFIER) goto LAB_00193d46;
                  if (lVar2 == LY_STMT_MUST) {
                    plVar19 = *object;
                    if (plVar19 == (lysp_node *)0x0) goto LAB_00193d5c;
                    plVar5 = *identities;
                    local_50 = plVar19;
                    if (plVar5 == (lysc_ident *)0x0) {
                      plVar12 = (long *)calloc(1,(long)plVar19[-1].exts * 0x38 + 8);
                      if (plVar12 == (long *)0x0) goto LAB_0019435a;
                      lVar22 = 0;
                    }
                    else {
                      lVar22 = *(long *)&plVar5[-1].flags;
                      plVar12 = (long *)realloc(&plVar5[-1].flags,
                                                ((long)&(plVar19[-1].exts)->name + lVar22 * 2) *
                                                0x38 + 8);
                      if (plVar12 == (long *)0x0) goto LAB_0019435a;
                      identities = (lysc_ident **)plVar16->storage_p;
                    }
                    *identities = (lysc_ident *)(plVar12 + 1);
                    if (*plVar16->storage_p != (void *)0x0) {
                      memset((void *)((long)*plVar16->storage_p + *plVar12 * 0x38),0,
                             ((long)&(local_50[-1].exts)->name + lVar22) * 0x38);
                    }
                    plVar23 = (lysp_ext_instance *)0xffffffffffffffff;
                    plVar19 = local_50;
                    LVar17 = LVar11;
                    while (LVar11 = LVar17,
                          plVar23 = (lysp_ext_instance *)((long)&plVar23->name + 1),
                          plVar23 < local_50[-1].exts) {
                      pvVar6 = *plVar16->storage_p;
                      lVar22 = *(long *)((long)pvVar6 + -8);
                      *(long *)((long)pvVar6 + -8) = lVar22 + 1;
                      LVar11 = lys_compile_must(ctx,(lysp_restr *)plVar19,
                                                (lysc_must *)(lVar22 * 0x38 + (long)pvVar6));
                      plVar19 = plVar19 + 1;
                      LVar17 = LY_SUCCESS;
                      if (LVar11 != LY_SUCCESS) goto LAB_00194207;
                    }
                    goto LAB_00193d5c;
                  }
                  if (lVar2 != LY_STMT_NAMESPACE) {
                    if (lVar2 == LY_STMT_ORDERED_BY) goto LAB_00193e31;
                    if (lVar2 != LY_STMT_ORGANIZATION) {
                      if (lVar2 == LY_STMT_PATTERN) {
                        LVar11 = lys_compile_type_patterns
                                           (ctx,(lysp_restr *)*object,(lysc_pattern **)0x0,
                                            (lysc_pattern ***)identities);
                      }
                      else {
                        if (lVar2 == LY_STMT_POSITION) {
LAB_00193e73:
                          *identities = (lysc_ident *)*object;
                          goto LAB_00193d5c;
                        }
                        if (lVar2 == LY_STMT_PRESENCE) goto LAB_00193d46;
                        if (lVar2 == LY_STMT_RANGE) {
                          lVar9 = '\0';
                          goto LAB_0019400d;
                        }
                        if (lVar2 == LY_STMT_REFERENCE) goto LAB_00193d46;
                        if (lVar2 == LY_STMT_REQUIRE_INSTANCE) goto LAB_00193e67;
                        if (lVar2 == LY_STMT_STATUS) goto LAB_00193e31;
                        if (lVar2 == LY_STMT_TYPE) {
                          type_p = (lysp_type *)*object;
                          lyplg_ext_get_storage(ext,0x2c0000,2,(void **)&flags_2);
                          lyplg_ext_get_storage(ext,0x310000,8,(void **)&enabled);
                          LVar11 = lys_compile_type(ctx,(lysp_node *)0x0,flags_2,ext->def->name,
                                                    type_p,(lysc_type **)plVar16->storage_p,
                                                    (char **)&enabled,(lysp_qname **)0x0);
                          if (LVar11 == LY_SUCCESS) {
                            LOCK();
                            piVar1 = (int *)((long)*plVar16->storage_p + 0x1c);
                            *piVar1 = *piVar1 + 1;
                            UNLOCK();
                          }
                          goto LAB_00193d5c;
                        }
                        if (lVar2 == LY_STMT_UNITS) goto LAB_00193d46;
                        if (lVar2 == LY_STMT_VALUE) goto LAB_00193e73;
                        if (lVar2 != LY_STMT_WHEN) {
                          if (((((((lVar2 == LY_STMT_AUGMENT) || (lVar2 == LY_STMT_GROUPING)) ||
                                 (lVar2 == LY_STMT_BASE)) ||
                                ((lVar2 == LY_STMT_BELONGS_TO || (lVar2 == LY_STMT_DEFAULT)))) ||
                               (lVar2 == LY_STMT_DEVIATE)) ||
                              (((((lVar2 == LY_STMT_DEVIATION || (lVar2 == LY_STMT_EXTENSION)) ||
                                 ((lVar2 == LY_STMT_FEATURE ||
                                  (((lVar2 == LY_STMT_IF_FEATURE || (lVar2 == LY_STMT_IMPORT)) ||
                                   (lVar2 == LY_STMT_INCLUDE)))))) ||
                                ((lVar2 == LY_STMT_MODULE || (lVar2 == LY_STMT_PATH)))) ||
                               (lVar2 == LY_STMT_PREFIX)))) ||
                             ((((lVar2 == LY_STMT_REFINE || (lVar2 == LY_STMT_REVISION)) ||
                               ((lVar2 == LY_STMT_REVISION_DATE ||
                                (((lVar2 == LY_STMT_SUBMODULE || (lVar2 == LY_STMT_TYPEDEF)) ||
                                 (lVar2 == LY_STMT_UNIQUE)))))) ||
                              ((lVar2 == LY_STMT_YANG_VERSION || (lVar2 == LY_STMT_YIN_ELEMENT))))))
                          {
                            plVar20 = ctx->ctx;
                            pcVar13 = lyplg_ext_stmt2str(lVar2);
                            ly_vlog(plVar20,(char *)0x0,LYVE_SYNTAX_YANG,
                                    "Statement \"%s\" compilation is not supported.",pcVar13);
                          }
                          else {
                            plVar20 = ctx->ctx;
                            pcVar14 = lyplg_ext_stmt2str(lVar2);
                            pcVar13 = ext->argument;
                            pcVar7 = ", ";
                            if (pcVar13 == (char *)0x0) {
                              pcVar7 = "\t";
                              pcVar13 = "";
                            }
                            ly_vlog(plVar20,(char *)0x0,LYVE_SYNTAX_YANG,
                                    "Statement \"%s\" is not supported as an extension (found in \"%s%s%s\") substatement."
                                    ,pcVar14,ext->def->name,pcVar7 + 1,pcVar13);
                          }
                          LVar11 = LY_EVALID;
                          goto LAB_00194207;
                        }
                        plVar19 = *object;
                        lyplg_ext_get_storage(ext,0x2c0000,2,(void **)&enabled);
                        LVar11 = lys_compile_when(ctx,(lysp_when *)plVar19,_enabled,(lysc_node *)0x0
                                                  ,(lysc_node *)0x0,(lysc_node *)0x0,
                                                  (lysc_when **)plVar16->storage_p);
                      }
                      goto LAB_00193d5c;
                    }
                  }
                  goto LAB_00193d46;
                }
                *(undefined4 *)identities = *(undefined4 *)object;
              }
            }
            goto LAB_00193d5c;
          }
        }
LAB_00193d46:
        LVar11 = lydict_insert(ctx->ctx,(char *)*object,0,(char **)identities);
      }
    }
  }
LAB_00193d5c:
  if (LVar11 != LY_SUCCESS) goto LAB_00194207;
LAB_00193d67:
  ly_set_add(&storagep_compiled,object,'\x01',(uint32_t *)0x0);
LAB_00193d81:
  ppvVar25 = (void **)((long)ppvVar25 + 1);
  goto LAB_00193a59;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyplg_ext_compile_extension_instance(struct lysc_ctx *ctx, const struct lysp_ext_instance *extp,
        struct lysc_ext_instance *ext)
{
    LY_ERR rc = LY_SUCCESS;
    LY_ARRAY_COUNT_TYPE u, v;
    enum ly_stmt stmtp;
    void **storagep;
    struct ly_set storagep_compiled = {0};

    LY_CHECK_ARG_RET(ctx ? ctx->ctx : NULL, ctx, extp, ext, LY_EINVAL);

    /* note into the compile context that we are processing extension now */
    ctx->ext = ext;

    LY_ARRAY_FOR(extp->substmts, u) {
        stmtp = extp->substmts[u].stmt;
        storagep = extp->substmts[u].storage_p;

        if (!*storagep || ly_set_contains(&storagep_compiled, storagep, NULL)) {
            /* nothing parsed or already compiled (for example, if it is a linked list of parsed nodes) */
            continue;
        }

        LY_ARRAY_FOR(ext->substmts, v) {
            if (stmtp != ext->substmts[v].stmt) {
                continue;
            }

            if ((rc = lys_compile_ext_instance_stmt(ctx, storagep, ext, &ext->substmts[v]))) {
                goto cleanup;
            }

            /* parsed substatement compiled */
            break;
        }

        /* compiled */
        ly_set_add(&storagep_compiled, storagep, 1, NULL);
    }

cleanup:
    ctx->ext = NULL;
    ly_set_erase(&storagep_compiled, NULL);
    return rc;
}